

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpsinput.cpp
# Opt level: O0

void __thiscall soplex::MPSInput::insertName(MPSInput *this,char *name,bool second)

{
  bool second_local;
  char *name_local;
  MPSInput *this_local;
  
  this->m_f5 = this->m_f4;
  this->m_f4 = this->m_f3;
  this->m_f3 = this->m_f2;
  if (second) {
    this->m_f2 = name;
  }
  else {
    this->m_f2 = this->m_f1;
    this->m_f1 = name;
  }
  return;
}

Assistant:

void MPSInput::insertName(const char* name, bool second)
{
   m_f5 = m_f4;
   m_f4 = m_f3;
   m_f3 = m_f2;

   if(second)
      m_f2 = name;
   else
   {
      m_f2 = m_f1;
      m_f1 = name;
   }
}